

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O2

FT_Error af_axis_hints_new_edge
                   (AF_AxisHints axis,FT_Int fpos,AF_Direction dir,FT_Bool top_to_bottom_hinting,
                   FT_Memory memory,AF_Edge_conflict *anedge)

{
  AF_Edge_conflict pAVar1;
  uint uVar2;
  undefined6 uVar3;
  uint uVar4;
  AF_Edge_conflict pAVar5;
  AF_Edge_conflict pAVar6;
  int iVar7;
  long lVar8;
  AF_Edge_conflict pAVar9;
  AF_Edge_conflict pAVar10;
  byte bVar11;
  FT_Error error;
  uint local_3c;
  AF_EdgeRec *local_38;
  
  bVar11 = 0;
  error = 0;
  uVar4 = axis->num_edges;
  if (uVar4 < 0xc) {
    if (axis->edges == (AF_Edge_conflict)0x0) {
      axis->edges = (axis->embedded).edges;
      axis->max_edges = 0xc;
    }
  }
  else {
    uVar2 = axis->max_edges;
    if (uVar2 <= uVar4) {
      if (0x1745d16 < uVar2) {
        error = 0x40;
LAB_0022aaea:
        pAVar5 = (AF_Edge_conflict)0x0;
        goto LAB_0022aa7f;
      }
      uVar4 = (uVar2 >> 2) + uVar2 + 4;
      local_3c = 0x1745d17;
      if (uVar4 < 0x1745d17) {
        local_3c = uVar4;
      }
      local_38 = (axis->embedded).edges;
      if (axis->edges == local_38) {
        pAVar5 = (AF_Edge_conflict)0x0;
        pAVar6 = (AF_Edge_conflict)ft_mem_realloc(memory,0x58,0,(ulong)local_3c,(void *)0x0,&error);
        axis->edges = pAVar6;
        if (error != 0) goto LAB_0022aa7f;
        memcpy(pAVar6,local_38,0x420);
      }
      else {
        pAVar5 = (AF_Edge_conflict)
                 ft_mem_realloc(memory,0x58,(ulong)uVar2,(ulong)local_3c,axis->edges,&error);
        axis->edges = pAVar5;
        if (error != 0) goto LAB_0022aaea;
      }
      axis->max_edges = local_3c;
      uVar4 = axis->num_edges;
    }
  }
  pAVar6 = axis->edges;
  pAVar5 = pAVar6 + uVar4;
  while (pAVar6 < pAVar5) {
    iVar7 = (int)pAVar5[-1].fpos;
    if (top_to_bottom_hinting == '\0') {
      if (iVar7 < fpos) break;
    }
    else if (fpos < iVar7) break;
    if ((iVar7 == fpos) && (axis->major_dir == dir)) break;
    pAVar1 = pAVar5 + -1;
    pAVar9 = pAVar1;
    pAVar10 = pAVar5;
    for (lVar8 = 0xb; pAVar5 = pAVar1, lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar3 = *(undefined6 *)&pAVar9->field_0x2;
      pAVar10->fpos = pAVar9->fpos;
      *(undefined6 *)&pAVar10->field_0x2 = uVar3;
      pAVar9 = (AF_Edge_conflict)((long)pAVar9 + (ulong)bVar11 * -0x10 + 8);
      pAVar10 = (AF_Edge_conflict)((long)pAVar10 + (ulong)bVar11 * -0x10 + 8);
    }
  }
  axis->num_edges = axis->num_edges + 1;
  error = 0;
LAB_0022aa7f:
  *anedge = pAVar5;
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_axis_hints_new_edge( AF_AxisHints  axis,
                          FT_Int        fpos,
                          AF_Direction  dir,
                          FT_Bool       top_to_bottom_hinting,
                          FT_Memory     memory,
                          AF_Edge      *anedge )
  {
    FT_Error  error = FT_Err_Ok;
    AF_Edge   edge  = NULL;
    AF_Edge   edges;


    if ( axis->num_edges < AF_EDGES_EMBEDDED )
    {
      if ( !axis->edges )
      {
        axis->edges     = axis->embedded.edges;
        axis->max_edges = AF_EDGES_EMBEDDED;
      }
    }
    else if ( axis->num_edges >= axis->max_edges )
    {
      FT_UInt  old_max = axis->max_edges;
      FT_UInt  new_max = old_max;
      FT_UInt  big_max = FT_INT_MAX / sizeof ( *edge );


      if ( old_max >= big_max )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }

      new_max += ( new_max >> 2 ) + 4;
      if ( new_max < old_max || new_max > big_max )
        new_max = big_max;

      if ( axis->edges == axis->embedded.edges )
      {
        if ( FT_NEW_ARRAY( axis->edges, new_max ) )
          goto Exit;
        ft_memcpy( axis->edges, axis->embedded.edges,
                   sizeof ( axis->embedded.edges ) );
      }
      else
      {
        if ( FT_RENEW_ARRAY( axis->edges, old_max, new_max ) )
          goto Exit;
      }

      axis->max_edges = new_max;
    }

    edges = axis->edges;
    edge  = edges + axis->num_edges;

    while ( edge > edges )
    {
      if ( top_to_bottom_hinting ? ( edge[-1].fpos > fpos )
                                 : ( edge[-1].fpos < fpos ) )
        break;

      /* we want the edge with same position and minor direction */
      /* to appear before those in the major one in the list     */
      if ( edge[-1].fpos == fpos && dir == axis->major_dir )
        break;

      edge[0] = edge[-1];
      edge--;
    }

    axis->num_edges++;

  Exit:
    *anedge = edge;
    return error;
  }